

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwWaitEventsTimeout(double timeout)

{
  double unaff_retaddr;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if ((0.0 <= timeout) && (timeout <= 1.79769313486232e+308)) {
    _glfwPlatformWaitEventsTimeout(unaff_retaddr);
    return;
  }
  _glfwInputError(0x10004,"Invalid time %f");
  return;
}

Assistant:

GLFWAPI void glfwWaitEventsTimeout(double timeout)
{
    _GLFW_REQUIRE_INIT();
    assert(timeout == timeout);
    assert(timeout >= 0.0);
    assert(timeout <= DBL_MAX);

    if (timeout != timeout || timeout < 0.0 || timeout > DBL_MAX)
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Invalid time %f", timeout);
        return;
    }

    _glfwPlatformWaitEventsTimeout(timeout);
}